

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O2

Maybe<kj::Own<capnp::SchemaFile,_std::nullptr_t>_> __thiscall
capnp::SchemaFile::DiskSchemaFile::import(DiskSchemaFile *this,StringPtr target)

{
  Path *params_1;
  StringPtr pathText;
  undefined1 auVar1 [16];
  size_t sVar2;
  bool bVar3;
  size_t in_RCX;
  anon_class_24_3_14160855 *func;
  SchemaFile *extraout_RDX;
  long lVar4;
  String *pSVar5;
  DiskSchemaFile *pDVar6;
  Array<kj::String> *this_00;
  DiskSchemaFile *pDVar7;
  Maybe<kj::Own<capnp::SchemaFile,_std::nullptr_t>_> MVar8;
  StringPtr path;
  OwnOwn<const_kj::ReadableFile,_std::nullptr_t> _newFile403;
  Path parsed_1;
  Path parsed;
  Own<capnp::SchemaFile::DiskSchemaFile,_std::nullptr_t> local_268;
  Own<capnp::SchemaFile,_std::nullptr_t> local_258;
  StringPtr *local_248;
  Array<kj::String> local_238;
  Own<capnp::SchemaFile::DiskSchemaFile,_std::nullptr_t> local_220;
  undefined1 local_210 [8];
  anon_union_24_1_a8c68091_for_NullableValue<kj::String>_2 local_208;
  StringPtr local_1f0;
  Own<const_kj::ReadableFile,_std::nullptr_t> *local_1e0;
  ReadableDirectory **local_1d8;
  long local_1d0;
  NullableValue<kj::Exception> local_1c8;
  
  local_1f0.content.ptr = (char *)target.content.size_;
  pDVar6 = (DiskSchemaFile *)target.content.ptr;
  local_208.value.content.ptr = (char *)2;
  local_210 = (undefined1  [8])(ReadableDirectory **)0x4e9b66;
  local_1f0.content.size_ = in_RCX;
  bVar3 = kj::StringPtr::startsWith(&local_1f0,(StringPtr *)local_210);
  if (bVar3) {
    path.content.ptr = local_1f0.content.ptr + 1;
    path.content.size_ = local_1f0.content.size_ - 1;
    kj::Path::parse((Path *)local_210,path);
    local_1e0 = (Own<const_kj::ReadableFile,_std::nullptr_t> *)&pDVar6->importPath;
    local_1d8 = (pDVar6->importPath).ptr;
    pSVar5 = (String *)(this->super_SchemaFile)._vptr_SchemaFile;
    pDVar7 = (DiskSchemaFile *)this->baseDir;
    local_1d0 = (pDVar6->importPath).size_ << 3;
    lVar4 = 0;
    do {
      if (local_1d0 == lVar4) {
        (this->super_SchemaFile)._vptr_SchemaFile = (_func_int **)0x0;
        this->baseDir = (ReadableDirectory *)0x0;
        goto LAB_0032e073;
      }
      params_1 = *(Path **)((long)local_1d8 + lVar4);
      (*(code *)(params_1->parts).ptr[3].content.size_)
                (&local_258,params_1,local_210,local_208.value.content.ptr);
      local_238.ptr = (String *)local_258.disposer;
      local_238.size_ = (size_t)local_258.ptr;
      local_258.ptr = (SchemaFile *)0x0;
      kj::Own<const_kj::ReadableFile,_std::nullptr_t>::dispose
                ((Own<const_kj::ReadableFile,_std::nullptr_t> *)&local_258);
      sVar2 = local_238.size_;
      if ((DiskSchemaFile *)local_238.size_ != (DiskSchemaFile *)0x0) {
        kj::
        heap<capnp::SchemaFile::DiskSchemaFile,kj::ReadableDirectory_const&,kj::Path,kj::ArrayPtr<kj::ReadableDirectory_const*const>const&,kj::Own<kj::ReadableFile_const,decltype(nullptr)>,kj::None_const&>
                  ((ReadableDirectory *)&local_268,params_1,
                   (ArrayPtr<const_kj::ReadableDirectory_*const> *)local_210,local_1e0,
                   (None *)&local_238);
        pDVar7 = local_268.ptr;
        pSVar5 = (String *)local_268.disposer;
        local_268.ptr = (DiskSchemaFile *)0x0;
        local_258.disposer = local_268.disposer;
        local_258.ptr = (SchemaFile *)0x0;
        kj::Own<capnp::SchemaFile,_std::nullptr_t>::dispose(&local_258);
        kj::Own<capnp::SchemaFile::DiskSchemaFile,_std::nullptr_t>::dispose(&local_268);
      }
      kj::Own<const_kj::ReadableFile,_std::nullptr_t>::dispose
                ((Own<const_kj::ReadableFile,_std::nullptr_t> *)&local_238);
      lVar4 = lVar4 + 8;
    } while ((DiskSchemaFile *)sVar2 == (DiskSchemaFile *)0x0);
    this->baseDir = (ReadableDirectory *)pDVar7;
    (this->super_SchemaFile)._vptr_SchemaFile = (_func_int **)pSVar5;
LAB_0032e073:
    this_00 = (Array<kj::String> *)local_210;
  }
  else {
    _local_210 = (ArrayPtr<const_kj::String>)kj::Path::parent(&pDVar6->path);
    pathText.content.size_ = local_1f0.content.size_;
    pathText.content.ptr = local_1f0.content.ptr;
    kj::PathPtr::eval((Path *)&local_238,(PathPtr *)local_210,pathText);
    auVar1[0xf] = 0;
    auVar1._0_15_ = stack0xfffffffffffffdf1;
    _local_210 = (ArrayPtr<const_kj::String>)(auVar1 << 8);
    if (pDVar6->displayNameOverridden == true) {
      local_258.disposer = (Disposer *)local_210;
      local_258.ptr = (SchemaFile *)pDVar6;
      local_248 = &local_1f0;
      kj::
      runCatchingExceptions<capnp::SchemaFile::DiskSchemaFile::import(kj::StringPtr)const::_lambda()_1_>
                ((Maybe<kj::Exception> *)&local_1c8,(kj *)&local_258,func);
      kj::_::NullableValue<kj::Exception>::~NullableValue(&local_1c8);
    }
    (*(pDVar6->baseDir->super_FsNode)._vptr_FsNode[10])
              (&local_268,pDVar6->baseDir,local_238.ptr,local_238.size_);
    pDVar7 = local_268.ptr;
    local_258.disposer = local_268.disposer;
    local_258.ptr = &(local_268.ptr)->super_SchemaFile;
    local_268.ptr = (DiskSchemaFile *)0x0;
    kj::Own<const_kj::ReadableFile,_std::nullptr_t>::dispose
              ((Own<const_kj::ReadableFile,_std::nullptr_t> *)&local_268);
    if (pDVar7 == (DiskSchemaFile *)0x0) {
      (this->super_SchemaFile)._vptr_SchemaFile = (_func_int **)0x0;
      this->baseDir = (ReadableDirectory *)0x0;
    }
    else {
      kj::
      heap<capnp::SchemaFile::DiskSchemaFile,kj::ReadableDirectory_const&,kj::Path,kj::ArrayPtr<kj::ReadableDirectory_const*const>const&,kj::Own<kj::ReadableFile_const,decltype(nullptr)>,kj::Maybe<kj::String>>
                ((kj *)&local_220,pDVar6->baseDir,(Path *)&local_238,&pDVar6->importPath,
                 (Own<const_kj::ReadableFile,_std::nullptr_t> *)&local_258,
                 (Maybe<kj::String> *)local_210);
      pDVar6 = local_220.ptr;
      local_268.disposer = local_220.disposer;
      local_220.ptr = (DiskSchemaFile *)0x0;
      (this->super_SchemaFile)._vptr_SchemaFile = (_func_int **)local_220.disposer;
      this->baseDir = (ReadableDirectory *)pDVar6;
      local_268.ptr = (DiskSchemaFile *)0x0;
      kj::Own<capnp::SchemaFile,_std::nullptr_t>::dispose
                ((Own<capnp::SchemaFile,_std::nullptr_t> *)&local_268);
      kj::Own<capnp::SchemaFile::DiskSchemaFile,_std::nullptr_t>::dispose(&local_220);
    }
    kj::Own<const_kj::ReadableFile,_std::nullptr_t>::dispose
              ((Own<const_kj::ReadableFile,_std::nullptr_t> *)&local_258);
    kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)local_210);
    this_00 = &local_238;
  }
  kj::Array<kj::String>::~Array(this_00);
  MVar8.ptr.ptr = extraout_RDX;
  MVar8.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<capnp::SchemaFile,_std::nullptr_t>_>)MVar8.ptr;
}

Assistant:

kj::Maybe<kj::Own<SchemaFile>> import(kj::StringPtr target) const override {
    if (target.startsWith("/")) {
      auto parsed = kj::Path::parse(target.slice(1));
      for (auto candidate: importPath) {
        KJ_IF_SOME(newFile, candidate->tryOpenFile(parsed)) {
          return kj::implicitCast<kj::Own<SchemaFile>>(kj::heap<DiskSchemaFile>(
              *candidate, kj::mv(parsed), importPath, kj::mv(newFile), kj::none));
        }
      }
      return kj::none;
    } else {
      auto parsed = path.parent().eval(target);

      kj::Maybe<kj::String> displayNameOverride;
      if (displayNameOverridden) {
        // Try to create a consistent display name override for the imported file. This is for
        // backwards-compatibility only -- display names are only overridden when using the
        // deprecated parseDiskFile() interface.
        kj::runCatchingExceptions([&]() {
          displayNameOverride = kj::Path::parse(displayName).parent().eval(target).toString();
        });
      }

      KJ_IF_SOME(newFile, baseDir.tryOpenFile(parsed)) {
        return kj::implicitCast<kj::Own<SchemaFile>>(kj::heap<DiskSchemaFile>(
            baseDir, kj::mv(parsed), importPath, kj::mv(newFile), kj::mv(displayNameOverride)));
      } else {
        return kj::none;
      }
    }